

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int get_http_header_len(char *buf,int buflen)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  ushort **ppuVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  
  if (0 < buflen) {
    iVar3 = buflen + -1;
    iVar5 = buflen + -3;
    uVar2 = (ulong)(uint)buflen;
    uVar6 = 0;
    do {
      bVar1 = buf[uVar6];
      if (((((char)bVar1 < '\0') || (bVar1 == 10)) || (bVar1 == 0xd)) ||
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (ulong)bVar1 * 2 + 1) & 0x40) != 0)
         ) {
        if ((bVar1 == 10 && (long)uVar6 < (long)iVar3) && (buf[uVar6 + 1] == '\n')) {
          buflen = (int)uVar6 + 2;
          goto LAB_0011a4cb;
        }
        bVar7 = true;
        if (((bVar1 == 0xd && (long)uVar6 < (long)iVar5) && (buf[uVar6 + 1] == '\n')) &&
           (buf[uVar6 + 2] == '\r')) {
          bVar7 = buf[uVar6 + 3] != '\n';
          if (!bVar7) {
            buflen = (int)uVar6 + 4;
          }
        }
      }
      else {
        buflen = -1;
LAB_0011a4cb:
        bVar7 = false;
      }
      if (!bVar7) {
        return buflen;
      }
      uVar6 = uVar6 + 1;
    } while (uVar2 != uVar6);
  }
  return 0;
}

Assistant:

static int
get_http_header_len(const char *buf, int buflen)
{
	int i;
	for (i = 0; i < buflen; i++) {
		/* Do an unsigned comparison in some conditions below */
		const unsigned char c = (unsigned char)buf[i];

		if ((c < 128) && ((char)c != '\r') && ((char)c != '\n')
		    && !isprint(c)) {
			/* abort scan as soon as one malformed character is found */
			return -1;
		}

		if (i < buflen - 1) {
			if ((buf[i] == '\n') && (buf[i + 1] == '\n')) {
				/* Two newline, no carriage return - not standard compliant,
				 * but it should be accepted */
				return i + 2;
			}
		}

		if (i < buflen - 3) {
			if ((buf[i] == '\r') && (buf[i + 1] == '\n') && (buf[i + 2] == '\r')
			    && (buf[i + 3] == '\n')) {
				/* Two \r\n - standard compliant */
				return i + 4;
			}
		}
	}

	return 0;
}